

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

GLenum gl4cts::GLSL420Pack::Utils::getTextureTartet(TEXTURE_TYPES type)

{
  TestError *this;
  GLenum local_10;
  GLenum result;
  TEXTURE_TYPES type_local;
  
  switch(type) {
  case TEX_BUFFER:
    local_10 = 0x8c2a;
    break;
  case TEX_2D:
    local_10 = 0xde1;
    break;
  case TEX_2D_RECT:
    local_10 = 0x84f5;
    break;
  case TEX_2D_ARRAY:
    local_10 = 0x8c1a;
    break;
  case TEX_3D:
    local_10 = 0x806f;
    break;
  case TEX_CUBE:
    local_10 = 0x8513;
    break;
  case TEX_1D:
    local_10 = 0xde0;
    break;
  case TEX_1D_ARRAY:
    local_10 = 0x8c18;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x202);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_10;
}

Assistant:

GLenum Utils::getTextureTartet(Utils::TEXTURE_TYPES type)
{
	GLenum result = 0;

	switch (type)
	{
	case TEX_BUFFER:
		result = GL_TEXTURE_BUFFER;
		break;
	case TEX_2D:
		result = GL_TEXTURE_2D;
		break;
	case TEX_2D_RECT:
		result = GL_TEXTURE_RECTANGLE;
		break;
	case TEX_2D_ARRAY:
		result = GL_TEXTURE_2D_ARRAY;
		break;
	case TEX_3D:
		result = GL_TEXTURE_3D;
		break;
	case TEX_CUBE:
		result = GL_TEXTURE_CUBE_MAP;
		break;
	case TEX_1D:
		result = GL_TEXTURE_1D;
		break;
	case TEX_1D_ARRAY:
		result = GL_TEXTURE_1D_ARRAY;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return result;
}